

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * keyInfoFromExprList(Parse *pParse,ExprList *pList,int iStart,int nExtra)

{
  int iVar1;
  sqlite3 *db_00;
  KeyInfo *pKVar2;
  CollSeq *local_50;
  CollSeq *pColl;
  int i;
  sqlite3 *db;
  ExprList_item *pItem;
  KeyInfo *pInfo;
  int nExpr;
  int nExtra_local;
  int iStart_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  iVar1 = pList->nExpr;
  pKVar2 = sqlite3KeyInfoAlloc(db_00,iVar1 - iStart,nExtra + 1);
  if (pKVar2 != (KeyInfo *)0x0) {
    db = (sqlite3 *)(pList->a + iStart);
    for (pColl._4_4_ = iStart; pColl._4_4_ < iVar1; pColl._4_4_ = pColl._4_4_ + 1) {
      local_50 = sqlite3ExprCollSeq(pParse,(Expr *)db->pVfs);
      if (local_50 == (CollSeq *)0x0) {
        local_50 = db_00->pDfltColl;
      }
      pKVar2->aColl[pColl._4_4_ - iStart] = local_50;
      pKVar2->aSortOrder[pColl._4_4_ - iStart] = *(u8 *)&db->mutex;
      db = (sqlite3 *)&db->aDb;
    }
  }
  return pKVar2;
}

Assistant:

static KeyInfo *keyInfoFromExprList(
  Parse *pParse,       /* Parsing context */
  ExprList *pList,     /* Form the KeyInfo object from this ExprList */
  int iStart,          /* Begin with this column of pList */
  int nExtra           /* Add this many extra columns to the end */
){
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3KeyInfoAlloc(db, nExpr-iStart, nExtra+1);
  if( pInfo ){
    assert( sqlite3KeyInfoIsWriteable(pInfo) );
    for(i=iStart, pItem=pList->a+iStart; i<nExpr; i++, pItem++){
      CollSeq *pColl;
      pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      if( !pColl ) pColl = db->pDfltColl;
      pInfo->aColl[i-iStart] = pColl;
      pInfo->aSortOrder[i-iStart] = pItem->sortOrder;
    }
  }
  return pInfo;
}